

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86.cpp
# Opt level: O0

int __thiscall
ncnn::BatchNorm_x86::forward_inplace(BatchNorm_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  float *pfVar5;
  Mat *in_RSI;
  long *in_RDI;
  __m128 _p_3;
  __m128 _b128;
  __m128 _a128;
  int i_3;
  float b;
  float a;
  float *ptr_3;
  int q_1;
  int size;
  int d;
  int h;
  int w;
  __m128 _p_2;
  int i_2;
  float *ptr_2;
  __m128 _b_2;
  __m128 _a_2;
  int q;
  int size_1;
  int c;
  int d_1;
  int h_2;
  int w_3;
  __m128 _p_1;
  int j;
  float *ptr_1;
  __m128 _b_1;
  __m128 _a_1;
  int i_1;
  int h_1;
  int w_2;
  __m128 _p;
  __m128 _b;
  __m128 _a;
  float *ptr;
  int i;
  int w_1;
  int elempack;
  int dims;
  Mat *in_stack_fffffffffffffbd8;
  undefined8 uStack_420;
  int local_3ec;
  Mat local_3e0;
  float *local_398;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  int iVar6;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  undefined4 in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  undefined8 local_378;
  undefined8 uStack_370;
  int local_368;
  Mat local_358;
  float *local_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  int local_2e0;
  int local_2dc;
  int local_2d8;
  int local_2d4;
  int local_2d0;
  int local_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  int local_2b4;
  float *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  int local_284;
  int local_280;
  int local_27c;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  float *local_240;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  Mat *local_220;
  int local_20c;
  float *local_208;
  float *local_200;
  float *local_1f8;
  float *local_1f0;
  float *local_1e8;
  float *local_1e0;
  float *local_1d8;
  float *local_1d0;
  float *local_1c8;
  float *local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  Mat *local_b8;
  undefined8 uStack_b0;
  float *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  float *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  float *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  float *local_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  float local_4;
  
  local_22c = in_RSI->dims;
  local_230 = in_RSI->elempack;
  if (local_230 == 4) {
    local_230 = 4;
    local_220 = in_RSI;
    if (local_22c == 1) {
      local_234 = in_RSI->w;
      for (local_238 = 0; local_238 < local_234; local_238 = local_238 + 1) {
        local_240 = ncnn::Mat::operator_cast_to_float_(local_220);
        local_240 = local_240 + (local_238 << 2);
        local_1c0 = ncnn::Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8));
        local_1c0 = local_1c0 + (local_238 << 2);
        local_258 = *(undefined8 *)local_1c0;
        uStack_250 = *(undefined8 *)(local_1c0 + 2);
        local_1c8 = ncnn::Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240));
        local_1c8 = local_1c8 + (local_238 << 2);
        local_268 = *(undefined8 *)local_1c8;
        uStack_260 = *(undefined8 *)(local_1c8 + 2);
        local_1d0 = local_240;
        uVar2 = *(undefined8 *)local_240;
        uVar3 = *(undefined8 *)(local_240 + 2);
        local_148._0_4_ = (float)uVar2;
        local_148._4_4_ = (float)((ulong)uVar2 >> 0x20);
        uStack_140._0_4_ = (float)uVar3;
        uStack_140._4_4_ = (float)((ulong)uVar3 >> 0x20);
        local_158._0_4_ = (float)local_268;
        local_158._4_4_ = (float)((ulong)local_268 >> 0x20);
        uStack_150._0_4_ = (float)uStack_260;
        uStack_150._4_4_ = (float)((ulong)uStack_260 >> 0x20);
        local_278 = CONCAT44(local_148._4_4_ * local_158._4_4_,(float)local_148 * (float)local_158);
        uStack_270 = CONCAT44(uStack_140._4_4_ * uStack_150._4_4_,
                              (float)uStack_140 * (float)uStack_150);
        local_c8 = local_278;
        uStack_c0 = uStack_270;
        local_d8._0_4_ = (float)local_258;
        local_d8._4_4_ = (float)((ulong)local_258 >> 0x20);
        uStack_d0._0_4_ = (float)uStack_250;
        uStack_d0._4_4_ = (float)((ulong)uStack_250 >> 0x20);
        local_278 = CONCAT44(local_148._4_4_ * local_158._4_4_ + local_d8._4_4_,
                             (float)local_148 * (float)local_158 + (float)local_d8);
        uStack_270 = CONCAT44(uStack_140._4_4_ * uStack_150._4_4_ + uStack_d0._4_4_,
                              (float)uStack_140 * (float)uStack_150 + (float)uStack_d0);
        local_40 = local_240;
        local_58 = local_278;
        uStack_50 = uStack_270;
        *(undefined8 *)local_240 = local_278;
        *(undefined8 *)(local_240 + 2) = uStack_270;
        local_158 = local_268;
        uStack_150 = uStack_260;
        local_148 = uVar2;
        uStack_140 = uVar3;
        local_d8 = local_258;
        uStack_d0 = uStack_250;
      }
    }
    if (local_22c == 2) {
      local_27c = local_220->w;
      local_280 = local_220->h;
      for (local_284 = 0; local_284 < local_280; local_284 = local_284 + 1) {
        local_1d8 = ncnn::Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8));
        local_1d8 = local_1d8 + (local_284 << 2);
        local_298 = *(undefined8 *)local_1d8;
        uStack_290 = *(undefined8 *)(local_1d8 + 2);
        local_1e0 = ncnn::Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240));
        local_1e0 = local_1e0 + (local_284 << 2);
        local_2a8 = *(undefined8 *)local_1e0;
        uStack_2a0 = *(undefined8 *)(local_1e0 + 2);
        local_2b0 = ncnn::Mat::row(local_220,local_284);
        for (local_2b4 = 0; local_2b4 < local_27c; local_2b4 = local_2b4 + 1) {
          local_1e8 = local_2b0;
          uVar2 = *(undefined8 *)local_2b0;
          uVar3 = *(undefined8 *)(local_2b0 + 2);
          local_168._0_4_ = (float)uVar2;
          local_168._4_4_ = (float)((ulong)uVar2 >> 0x20);
          uStack_160._0_4_ = (float)uVar3;
          uStack_160._4_4_ = (float)((ulong)uVar3 >> 0x20);
          local_178._0_4_ = (float)local_2a8;
          local_178._4_4_ = (float)((ulong)local_2a8 >> 0x20);
          uStack_170._0_4_ = (float)uStack_2a0;
          uStack_170._4_4_ = (float)((ulong)uStack_2a0 >> 0x20);
          local_2c8 = CONCAT44(local_168._4_4_ * local_178._4_4_,(float)local_168 * (float)local_178
                              );
          uStack_2c0 = CONCAT44(uStack_160._4_4_ * uStack_170._4_4_,
                                (float)uStack_160 * (float)uStack_170);
          local_e8 = local_2c8;
          uStack_e0 = uStack_2c0;
          local_f8._0_4_ = (float)local_298;
          local_f8._4_4_ = (float)((ulong)local_298 >> 0x20);
          uStack_f0._0_4_ = (float)uStack_290;
          uStack_f0._4_4_ = (float)((ulong)uStack_290 >> 0x20);
          local_2c8 = CONCAT44(local_168._4_4_ * local_178._4_4_ + local_f8._4_4_,
                               (float)local_168 * (float)local_178 + (float)local_f8);
          uStack_2c0 = CONCAT44(uStack_160._4_4_ * uStack_170._4_4_ + uStack_f0._4_4_,
                                (float)uStack_160 * (float)uStack_170 + (float)uStack_f0);
          local_60 = local_2b0;
          local_78 = local_2c8;
          uStack_70 = uStack_2c0;
          *(undefined8 *)local_2b0 = local_2c8;
          *(undefined8 *)(local_2b0 + 2) = uStack_2c0;
          local_2b0 = local_2b0 + 4;
          local_178 = local_2a8;
          uStack_170 = uStack_2a0;
          local_168 = uVar2;
          uStack_160 = uVar3;
          local_f8 = local_298;
          uStack_f0 = uStack_290;
        }
      }
    }
    if ((local_22c == 3) || (local_22c == 4)) {
      local_2cc = local_220->w;
      local_2d0 = local_220->h;
      local_2d4 = local_220->d;
      local_2d8 = local_220->c;
      local_2dc = local_2cc * local_2d0 * local_2d4;
      for (local_2e0 = 0; local_2e0 < local_2d8; local_2e0 = local_2e0 + 1) {
        local_1f0 = ncnn::Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8));
        local_1f0 = local_1f0 + (local_2e0 << 2);
        local_2f8 = *(undefined8 *)local_1f0;
        uStack_2f0 = *(undefined8 *)(local_1f0 + 2);
        local_1f8 = ncnn::Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240));
        local_1f8 = local_1f8 + (local_2e0 << 2);
        local_308 = *(undefined8 *)local_1f8;
        uStack_300 = *(undefined8 *)(local_1f8 + 2);
        ncnn::Mat::channel(in_stack_fffffffffffffbd8,(int)((ulong)in_RDI >> 0x20));
        pfVar5 = ncnn::Mat::operator_cast_to_float_(&local_358);
        ncnn::Mat::~Mat((Mat *)0x18e01f);
        local_310 = pfVar5;
        for (local_368 = 0; local_368 < local_2dc; local_368 = local_368 + 1) {
          local_200 = local_310;
          uVar2 = *(undefined8 *)local_310;
          uVar3 = *(undefined8 *)(local_310 + 2);
          local_188._0_4_ = (float)uVar2;
          local_188._4_4_ = (float)((ulong)uVar2 >> 0x20);
          uStack_180._0_4_ = (float)uVar3;
          uStack_180._4_4_ = (float)((ulong)uVar3 >> 0x20);
          local_198._0_4_ = (float)local_308;
          local_198._4_4_ = (float)((ulong)local_308 >> 0x20);
          uStack_190._0_4_ = (float)uStack_300;
          uStack_190._4_4_ = (float)((ulong)uStack_300 >> 0x20);
          local_378 = CONCAT44(local_188._4_4_ * local_198._4_4_,(float)local_188 * (float)local_198
                              );
          uStack_370 = CONCAT44(uStack_180._4_4_ * uStack_190._4_4_,
                                (float)uStack_180 * (float)uStack_190);
          local_108 = local_378;
          uStack_100 = uStack_370;
          local_118._0_4_ = (float)local_2f8;
          local_118._4_4_ = (float)((ulong)local_2f8 >> 0x20);
          uStack_110._0_4_ = (float)uStack_2f0;
          uStack_110._4_4_ = (float)((ulong)uStack_2f0 >> 0x20);
          local_378 = CONCAT44(local_188._4_4_ * local_198._4_4_ + local_118._4_4_,
                               (float)local_188 * (float)local_198 + (float)local_118);
          uStack_370 = CONCAT44(uStack_180._4_4_ * uStack_190._4_4_ + uStack_110._4_4_,
                                (float)uStack_180 * (float)uStack_190 + (float)uStack_110);
          local_80 = local_310;
          local_98 = local_378;
          uStack_90 = uStack_370;
          *(undefined8 *)local_310 = local_378;
          *(undefined8 *)(local_310 + 2) = uStack_370;
          local_310 = local_310 + 4;
          local_198 = local_308;
          uStack_190 = uStack_300;
          local_188 = uVar2;
          uStack_180 = uVar3;
          local_118 = local_2f8;
          uStack_110 = uStack_2f0;
        }
      }
    }
    local_20c = 0;
  }
  else if ((local_22c == 3) || (local_22c == 4)) {
    iVar4 = in_RSI->w * in_RSI->h * in_RSI->d;
    for (iVar6 = 0; iVar6 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        iVar6 = iVar6 + 1) {
      ncnn::Mat::channel(in_stack_fffffffffffffbd8,(int)((ulong)in_RDI >> 0x20));
      pfVar5 = ncnn::Mat::operator_cast_to_float_(&local_3e0);
      ncnn::Mat::~Mat((Mat *)0x18e284);
      local_398 = pfVar5;
      pfVar5 = ncnn::Mat::operator[]
                         ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8),(long)iVar6);
      fVar1 = *pfVar5;
      pfVar5 = ncnn::Mat::operator[]
                         ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240),(long)iVar6);
      local_38 = *pfVar5;
      for (local_3ec = 0; local_3ec + 3 < iVar4; local_3ec = local_3ec + 4) {
        local_208 = local_398;
        uVar2 = *(undefined8 *)local_398;
        uVar3 = *(undefined8 *)(local_398 + 2);
        local_1a8._0_4_ = (float)uVar2;
        local_1a8._4_4_ = (float)((ulong)uVar2 >> 0x20);
        uStack_1a0._0_4_ = (float)uVar3;
        uStack_1a0._4_4_ = (float)((ulong)uVar3 >> 0x20);
        local_128 = CONCAT44(local_1a8._4_4_ * local_38,(float)local_1a8 * local_38);
        uStack_420 = CONCAT44(uStack_1a0._4_4_ * local_38,(float)uStack_1a0 * local_38);
        uStack_120 = uStack_420;
        in_stack_fffffffffffffbd8 =
             (Mat *)CONCAT44(local_1a8._4_4_ * local_38 + fVar1,(float)local_1a8 * local_38 + fVar1)
        ;
        uStack_420 = CONCAT44(uStack_1a0._4_4_ * local_38 + fVar1,
                              (float)uStack_1a0 * local_38 + fVar1);
        local_a0 = local_398;
        uStack_b0 = uStack_420;
        *(Mat **)local_398 = in_stack_fffffffffffffbd8;
        *(undefined8 *)(local_398 + 2) = uStack_420;
        local_398 = local_398 + 4;
        local_1b8 = CONCAT44(local_38,local_38);
        uStack_1b0 = CONCAT44(local_38,local_38);
        local_1a8 = uVar2;
        uStack_1a0 = uVar3;
        local_138 = CONCAT44(fVar1,fVar1);
        uStack_130 = CONCAT44(fVar1,fVar1);
        local_b8 = in_stack_fffffffffffffbd8;
      }
      for (; local_3ec < iVar4; local_3ec = local_3ec + 1) {
        *local_398 = local_38 * *local_398 + fVar1;
        local_398 = local_398 + 1;
      }
      fStack_34 = local_38;
      fStack_30 = local_38;
      fStack_2c = local_38;
      local_28 = local_38;
      local_18 = fVar1;
      fStack_14 = fVar1;
      fStack_10 = fVar1;
      fStack_c = fVar1;
      local_4 = fVar1;
    }
    local_20c = 0;
  }
  else {
    local_20c = BatchNorm::forward_inplace
                          ((BatchNorm *)
                           CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                           (Mat *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                           (Option *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  }
  return local_20c;
}

Assistant:

int BatchNorm_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;

    int elempack = bottom_top_blob.elempack;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;

                __m256 _a = _mm256_loadu_ps((const float*)a_data + i * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + i * 8);

                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                __m256 _a = _mm256_loadu_ps((const float*)a_data + i * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + i * 8);

                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                    _mm256_storeu_ps(ptr, _p);

                    ptr += 8;
                }
            }
        }

        if (dims == 3 || dims == 4)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int d = bottom_top_blob.d;
            int c = bottom_top_blob.c;
            int size = w * h * d;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                __m256 _a = _mm256_loadu_ps((const float*)a_data + q * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + q * 8);

                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                    _mm256_storeu_ps(ptr, _p);

                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;

                __m128 _a = _mm_load_ps((const float*)a_data + i * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + i * 4);

                __m128 _p = _mm_load_ps(ptr);
                _p = _mm_mul_ps(_p, _b);
                _p = _mm_add_ps(_p, _a);
                _mm_store_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                __m128 _a = _mm_load_ps((const float*)a_data + i * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + i * 4);

                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _b);
                    _p = _mm_add_ps(_p, _a);
                    _mm_store_ps(ptr, _p);

                    ptr += 4;
                }
            }
        }

        if (dims == 3 || dims == 4)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int d = bottom_top_blob.d;
            int c = bottom_top_blob.c;
            int size = w * h * d;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                __m128 _a = _mm_load_ps((const float*)a_data + q * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + q * 4);

                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _b);
                    _p = _mm_add_ps(_p, _a);
                    _mm_store_ps(ptr, _p);

                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (dims != 3 && dims != 4)
        return BatchNorm::forward_inplace(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    // int c = bottom_top_blob.c;
    int size = w * h * d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float a = a_data[q];
        float b = b_data[q];

        int i = 0;
#if __SSE2__
#if __AVX__
        __m256 _a256 = _mm256_set1_ps(a);
        __m256 _b256 = _mm256_set1_ps(b);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_comp_fmadd_ps(_p, _b256, _a256);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
        __m128 _a128 = _mm256_castps256_ps128(_a256);
        __m128 _b128 = _mm256_castps256_ps128(_b256);
#else
        __m128 _a128 = _mm_set1_ps(a);
        __m128 _b128 = _mm_set1_ps(b);
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_mul_ps(_p, _b128);
            _p = _mm_add_ps(_p, _a128);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = b * *ptr + a;

            ptr++;
        }
    }

    return 0;
}